

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

int __thiscall
ON_LineCurve::IsPolyline
          (ON_LineCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  ON_SimpleArray<double> *pOVar1;
  uint uVar2;
  double local_38;
  double local_30;
  int local_24;
  ON_SimpleArray<double> *pOStack_20;
  int rc;
  ON_SimpleArray<double> *pline_t_local;
  ON_SimpleArray<ON_3dPoint> *pline_points_local;
  ON_LineCurve *this_local;
  
  local_24 = 0;
  pOStack_20 = pline_t;
  pline_t_local = (ON_SimpleArray<double> *)pline_points;
  pline_points_local = (ON_SimpleArray<ON_3dPoint> *)this;
  if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::SetCount(pline_points,0);
  }
  if (pOStack_20 != (ON_SimpleArray<double> *)0x0) {
    ON_SimpleArray<double>::SetCount(pOStack_20,0);
  }
  uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
  if ((uVar2 & 1) != 0) {
    local_24 = 2;
    if (pline_t_local != (ON_SimpleArray<double> *)0x0) {
      ON_SimpleArray<ON_3dPoint>::Reserve((ON_SimpleArray<ON_3dPoint> *)pline_t_local,2);
      ON_SimpleArray<ON_3dPoint>::Append
                ((ON_SimpleArray<ON_3dPoint> *)pline_t_local,&(this->m_line).from);
      ON_SimpleArray<ON_3dPoint>::Append
                ((ON_SimpleArray<ON_3dPoint> *)pline_t_local,&(this->m_line).to);
    }
    if (pOStack_20 != (ON_SimpleArray<double> *)0x0) {
      ON_SimpleArray<double>::Reserve(pOStack_20,2);
      pOVar1 = pOStack_20;
      local_30 = ON_Interval::operator[](&this->m_t,0);
      ON_SimpleArray<double>::Append(pOVar1,&local_30);
      pOVar1 = pOStack_20;
      local_38 = ON_Interval::operator[](&this->m_t,1);
      ON_SimpleArray<double>::Append(pOVar1,&local_38);
    }
  }
  return local_24;
}

Assistant:

int ON_LineCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  int rc = 0;
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  if ( IsValid() )
  {
    rc = 2;
    if ( pline_points )
    {
      pline_points->Reserve(2);
      pline_points->Append( m_line.from );
      pline_points->Append( m_line.to );
    }
    if ( pline_t )
    {
      pline_t->Reserve(2);
      pline_t->Append( m_t[0] );
      pline_t->Append( m_t[1] );
    }
  }
  return rc;
}